

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

pair<int,_int> __thiscall
ChainstateManager::GetPruneRange
          (ChainstateManager *this,Chainstate *chainstate,int last_height_can_prune)

{
  long lVar1;
  int iVar2;
  size_type sVar3;
  ChainstateManager *pCVar4;
  ChainstateManager *in_RSI;
  pair<int,_int> *in_RDI;
  long in_FS_OFFSET;
  int prune_end;
  int max_prune;
  int prune_start;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar5;
  undefined1 uVar6;
  pair<int,_int> *assertion;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  optional<int> *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffdc;
  pair<int,_int> local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  assertion = in_RDI;
  iVar2 = CChain::Height((CChain *)in_stack_ffffffffffffff88);
  if (iVar2 < 1) {
    std::pair<int,_int>::pair<int,_int,_true>
              (in_RDI,(int *)CONCAT17(in_stack_ffffffffffffff97,
                                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90))
               ,(int *)in_stack_ffffffffffffff88);
  }
  else {
    GetAll((ChainstateManager *)((ulong)in_stack_ffffffffffffffdc << 0x20));
    sVar3 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                      (in_stack_ffffffffffffff88);
    bVar5 = false;
    if (1 < sVar3) {
      pCVar4 = (ChainstateManager *)
               std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                         ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                          in_stack_ffffffffffffff88);
      bVar5 = pCVar4 == in_RSI;
    }
    uVar6 = bVar5;
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_RDI);
    if ((bVar5 & 1) != 0) {
      GetSnapshotBaseHeight(in_RSI);
      inline_assertion_check<true,std::optional<int>>
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                 (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)assertion);
      std::optional<int>::operator*((optional<int> *)in_stack_ffffffffffffff88);
    }
    CChain::Height((CChain *)in_stack_ffffffffffffff88);
    std::max<int>((int *)CONCAT17(uVar6,CONCAT16(bVar5,in_stack_ffffffffffffff90)),
                  (int *)in_stack_ffffffffffffff88);
    std::min<int>((int *)CONCAT17(uVar6,CONCAT16(bVar5,in_stack_ffffffffffffff90)),
                  (int *)in_stack_ffffffffffffff88);
    std::pair<int,_int>::pair<int_&,_int_&,_true>
              (in_RDI,(int *)CONCAT17(uVar6,CONCAT16(bVar5,in_stack_ffffffffffffff90)),
               (int *)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

std::pair<int, int> ChainstateManager::GetPruneRange(const Chainstate& chainstate, int last_height_can_prune)
{
    if (chainstate.m_chain.Height() <= 0) {
        return {0, 0};
    }
    int prune_start{0};

    if (this->GetAll().size() > 1 && m_snapshot_chainstate.get() == &chainstate) {
        // Leave the blocks in the background IBD chain alone if we're pruning
        // the snapshot chain.
        prune_start = *Assert(GetSnapshotBaseHeight()) + 1;
    }

    int max_prune = std::max<int>(
        0, chainstate.m_chain.Height() - static_cast<int>(MIN_BLOCKS_TO_KEEP));

    // last block to prune is the lesser of (caller-specified height, MIN_BLOCKS_TO_KEEP from the tip)
    //
    // While you might be tempted to prune the background chainstate more
    // aggressively (i.e. fewer MIN_BLOCKS_TO_KEEP), this won't work with index
    // building - specifically blockfilterindex requires undo data, and if
    // we don't maintain this trailing window, we hit indexing failures.
    int prune_end = std::min(last_height_can_prune, max_prune);

    return {prune_start, prune_end};
}